

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snappy.cc
# Opt level: O1

size_t duckdb_snappy::CompressFromIOVec
                 (iovec *iov,size_t iov_cnt,string *compressed,CompressionOptions options)

{
  size_t sVar1;
  bool bVar2;
  ulong in_RAX;
  size_t *psVar3;
  uint32_t uncompressed_len;
  ulong uVar4;
  char *pcVar5;
  char *pcVar6;
  pointer compressed_00;
  ulong uncompressed_length;
  size_t compressed_length;
  uint32_t uStack_10c;
  SnappyScatteredWriter<duckdb_snappy::SnappySinkAllocator> SStack_108;
  SnappyDecompressor SStack_a0;
  Sink *pSStack_70;
  vector<duckdb_snappy::SnappySinkAllocator::Datablock,_std::allocator<duckdb_snappy::SnappySinkAllocator::Datablock>_>
  vStack_68;
  string *psStack_50;
  iovec *piStack_48;
  code *pcStack_40;
  ulong local_38;
  
  if (iov_cnt == 0) {
    uncompressed_length = 0;
  }
  else {
    psVar3 = &iov->iov_len;
    uncompressed_length = 0;
    do {
      uncompressed_length = uncompressed_length + *psVar3;
      psVar3 = psVar3 + 2;
      iov_cnt = iov_cnt - 1;
    } while (iov_cnt != 0);
  }
  compressed_00 = (char *)0x0;
  pcStack_40 = (code *)0x2e5ab1;
  local_38 = in_RAX;
  std::__cxx11::string::resize
            ((ulong)compressed,(char)uncompressed_length + (char)(uncompressed_length / 6) + ' ');
  if (compressed->_M_string_length != 0) {
    compressed_00 = (compressed->_M_dataplus)._M_p;
  }
  pcStack_40 = (code *)0x2e5ad2;
  RawCompressFromIOVec(iov,uncompressed_length,compressed_00,&local_38,options);
  uVar4 = compressed->_M_string_length;
  if (uVar4 < local_38) {
    pcVar6 = "%s: __pos (which is %zu) > this->size() (which is %zu)";
    pcVar5 = "basic_string::erase";
    pcStack_40 = UncompressAsMuchAsPossible;
    std::__throw_out_of_range_fmt
              ("%s: __pos (which is %zu) > this->size() (which is %zu)","basic_string::erase",
               local_38);
    uncompressed_len = (uint32_t)uVar4;
    vStack_68.
    super__Vector_base<duckdb_snappy::SnappySinkAllocator::Datablock,_std::allocator<duckdb_snappy::SnappySinkAllocator::Datablock>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    vStack_68.
    super__Vector_base<duckdb_snappy::SnappySinkAllocator::Datablock,_std::allocator<duckdb_snappy::SnappySinkAllocator::Datablock>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    vStack_68.
    super__Vector_base<duckdb_snappy::SnappySinkAllocator::Datablock,_std::allocator<duckdb_snappy::SnappySinkAllocator::Datablock>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    SStack_108.allocator_.dest_ = (Sink *)pcVar5;
    pSStack_70 = (Sink *)pcVar5;
    psStack_50 = compressed;
    piStack_48 = iov;
    pcStack_40 = (code *)uncompressed_length;
    std::
    vector<duckdb_snappy::SnappySinkAllocator::Datablock,_std::allocator<duckdb_snappy::SnappySinkAllocator::Datablock>_>
    ::vector(&SStack_108.allocator_.blocks_,&vStack_68);
    SStack_108.blocks_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    SStack_108.blocks_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    SStack_108.blocks_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    SStack_108.full_size_ = 0;
    SStack_108.op_base_ = (char *)0x0;
    SStack_108.op_ptr_ = (char *)0x0;
    SStack_108.op_limit_ = (char *)0x0;
    SStack_108.op_limit_min_slop_ = (char *)0x0;
    SStack_a0.peeked_ = 0;
    SStack_a0.eof_ = false;
    SStack_a0.ip_ = (char *)0x0;
    SStack_a0.ip_limit_ = (char *)0x0;
    uStack_10c = 0;
    SStack_a0.reader_ = (Source *)pcVar6;
    bVar2 = SnappyDecompressor::ReadUncompressedLength(&SStack_a0,&uStack_10c);
    if (bVar2) {
      (*((Source *)pcVar6)->_vptr_Source[2])(pcVar6);
      InternalUncompressAllTags<duckdb_snappy::SnappyScatteredWriter<duckdb_snappy::SnappySinkAllocator>>
                (&SStack_a0,&SStack_108,uStack_10c,uncompressed_len);
    }
    (*(SStack_a0.reader_)->_vptr_Source[4])(SStack_a0.reader_,(ulong)SStack_a0.peeked_);
    pcVar6 = SStack_108.op_ptr_;
    pcVar5 = SStack_108.op_base_;
    sVar1 = SStack_108.full_size_;
    if (SStack_108.blocks_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(SStack_108.blocks_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl
                      .super__Vector_impl_data._M_start);
    }
    if (SStack_108.allocator_.blocks_.
        super__Vector_base<duckdb_snappy::SnappySinkAllocator::Datablock,_std::allocator<duckdb_snappy::SnappySinkAllocator::Datablock>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(SStack_108.allocator_.blocks_.
                      super__Vector_base<duckdb_snappy::SnappySinkAllocator::Datablock,_std::allocator<duckdb_snappy::SnappySinkAllocator::Datablock>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    if (vStack_68.
        super__Vector_base<duckdb_snappy::SnappySinkAllocator::Datablock,_std::allocator<duckdb_snappy::SnappySinkAllocator::Datablock>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(vStack_68.
                      super__Vector_base<duckdb_snappy::SnappySinkAllocator::Datablock,_std::allocator<duckdb_snappy::SnappySinkAllocator::Datablock>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    return (size_t)(pcVar6 + (sVar1 - (long)pcVar5));
  }
  compressed->_M_string_length = local_38;
  (compressed->_M_dataplus)._M_p[local_38] = '\0';
  return local_38;
}

Assistant:

size_t CompressFromIOVec(const struct iovec* iov, size_t iov_cnt,
                         std::string* compressed, CompressionOptions options) {
  // Compute the number of bytes to be compressed.
  size_t uncompressed_length = 0;
  for (size_t i = 0; i < iov_cnt; ++i) {
    uncompressed_length += iov[i].iov_len;
  }

  // Pre-grow the buffer to the max length of the compressed output.
  STLStringResizeUninitialized(compressed, MaxCompressedLength(
      uncompressed_length));

  size_t compressed_length;
  RawCompressFromIOVec(iov, uncompressed_length, string_as_array(compressed),
                       &compressed_length, options);
  compressed->erase(compressed_length);
  return compressed_length;
}